

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageClass(StackInterpreter *this)

{
  VMContext *this_00;
  Oop OVar1;
  Oop clazz;
  StackInterpreter *this_local;
  
  fetchNextInstructionOpcode(this);
  this_00 = this->context;
  OVar1 = popOop(this);
  OVar1 = VMContext::getClassFromOop(this_00,OVar1);
  pushOop(this,OVar1);
  return;
}

Assistant:

void interpretSpecialMessageClass()
    {
        fetchNextInstructionOpcode();
        Oop clazz = context->getClassFromOop(popOop());
        pushOop(clazz);
    }